

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_conn.cpp
# Opt level: O3

void __thiscall TcpConnection::~TcpConnection(TcpConnection *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _func_void__Op_any_ptr__Arg_ptr *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  undefined8 in_RAX;
  Logger *pLVar6;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_RAX >> 0x20);
  pLVar6 = Logger::get_instance();
  if ((pLVar6->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","~TcpConnection",0x22);
  }
  if (1 < (int)g_log_level) {
    pLVar6 = Logger::get_instance();
    Logger::write_log(pLVar6,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_conn.cpp"
                      ,"~TcpConnection",0x22,LOG_LEVEL_INFO,
                      "TcpConnection descontructed, fd is %d\n",CONCAT44(uVar7,this->tc_fd));
    pLVar6 = Logger::get_instance();
    Logger::flush(pLVar6);
  }
  p_Var2 = (this->tc_close_cb).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->tc_close_cb,(_Any_data *)&this->tc_close_cb,__destroy_functor);
  }
  p_Var2 = (this->tc_message_cb).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->tc_message_cb,(_Any_data *)&this->tc_message_cb,__destroy_functor)
    ;
  }
  p_Var2 = (this->tc_connected_cb).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->tc_connected_cb,(_Any_data *)&this->tc_connected_cb,
              __destroy_functor);
  }
  p_Var3 = (this->tc_context)._M_manager;
  if (p_Var3 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*p_Var3)(_Op_destroy,&this->tc_context,(_Arg *)0x0);
    (this->tc_context)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  BufferBase::~BufferBase(&(this->tc_ibuf).super_BufferBase);
  BufferBase::~BufferBase(&(this->tc_obuf).super_BufferBase);
  p_Var4 = (this->super_enable_shared_from_this<TcpConnection>)._M_weak_this.
           super___weak_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

TcpConnection::~TcpConnection() {
    LOG_INFO("TcpConnection descontructed, fd is %d\n", tc_fd);
}